

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# enet.h
# Opt level: O1

uint32_t enet_time_get(void)

{
  timespec ts;
  timespec local_18;
  
  clock_gettime(4,&local_18);
  local_18.tv_nsec = local_18.tv_sec * 1000000000 + local_18.tv_nsec;
  if (enet_time_get::start_time_ns == 0) {
    enet_time_get::start_time_ns = local_18.tv_nsec - 1000000;
    LOCK();
    UNLOCK();
  }
  return (uint32_t)((local_18.tv_nsec - enet_time_get::start_time_ns) / 1000000);
}

Assistant:

uint32_t enet_time_get(void) {
	static uint64_t start_time_ns = 0;

	struct timespec ts;

#ifdef CLOCK_MONOTONIC_RAW
	clock_gettime(CLOCK_MONOTONIC_RAW, &ts);
#else
	clock_gettime(CLOCK_MONOTONIC, &ts);
#endif

	static const uint64_t ns_in_s = 1000 * 1000 * 1000;
	static const uint64_t ns_in_ms = 1000 * 1000;

	uint64_t current_time_ns = ts.tv_nsec + (uint64_t)ts.tv_sec * ns_in_s;
	uint64_t offset_ns = ENET_ATOMIC_READ(&start_time_ns);

	if (offset_ns == 0) {
		uint64_t want_value = current_time_ns - 1 * ns_in_ms;
		uint64_t old_value = ENET_ATOMIC_CAS(&start_time_ns, 0, want_value);
		offset_ns = old_value == 0 ? want_value : old_value;
	}

	uint64_t result_in_ns = current_time_ns - offset_ns;

	return (uint32_t)(result_in_ns / ns_in_ms);
}